

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ppu_membank.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_305969::PpuMembankTest_the_palette_memory_is_mirrored_Test::
PpuMembankTest_the_palette_memory_is_mirrored_Test
          (PpuMembankTest_the_palette_memory_is_mirrored_Test *this)

{
  PpuMembankTest_the_palette_memory_is_mirrored_Test *this_local;
  
  PpuMembankTest::PpuMembankTest(&this->super_PpuMembankTest);
  (this->super_PpuMembankTest).super_Test._vptr_Test =
       (_func_int **)&PTR__PpuMembankTest_the_palette_memory_is_mirrored_Test_003f9c38;
  return;
}

Assistant:

TEST_F(PpuMembankTest, the_palette_memory_is_mirrored) {
    mmu->write_byte(0x3F00, 0x01);
    for (uint16_t addr = 0x3F00; addr < 0x4000; addr += 0x20) {
        EXPECT_EQ(0x01, mmu->read_byte(addr));
    }

    mmu->write_byte(0x3F1F, 0x07);
    for (uint16_t addr = 0x3F1F; addr < 0x4000; addr += 0x20) {
        EXPECT_EQ(0x07, mmu->read_byte(addr));
    }
}